

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_write_certificate(mbedtls_ssl_context *ssl)

{
  long lVar1;
  uint8_t uVar2;
  mbedtls_ssl_ciphersuite_t *pmVar3;
  ulong __n;
  uint uVar4;
  int ret;
  mbedtls_x509_crt *pmVar5;
  int line;
  size_t sVar6;
  
  pmVar3 = ssl->handshake->ciphersuite_info;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
             ,0x1b03,"=> write certificate");
  uVar4 = (uint)pmVar3->key_exchange;
  if ((uVar4 < 0xb) && ((0x69eU >> (uVar4 & 0x1f) & 1) != 0)) {
    uVar2 = ssl->conf->endpoint;
    if (uVar2 == '\x01') {
      pmVar5 = mbedtls_ssl_own_cert(ssl);
      if (pmVar5 == (mbedtls_x509_crt *)0x0) {
        return -0x6c00;
      }
    }
    else if ((uVar2 == '\0') && (ssl->handshake->client_auth == '\0')) {
      line = 0x1b0e;
      goto LAB_001cfab2;
    }
    pmVar5 = mbedtls_ssl_own_cert(ssl);
    mbedtls_debug_print_crt
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1b1e,"own certificate",pmVar5);
    pmVar5 = mbedtls_ssl_own_cert(ssl);
    sVar6 = 7;
    for (; pmVar5 != (mbedtls_x509_crt *)0x0; pmVar5 = pmVar5->next) {
      __n = (pmVar5->raw).len;
      if (0x3fd - sVar6 < __n) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1b31,"certificate too large, %zu > %zu",sVar6 + __n + 3,0x400);
        return -0x6a00;
      }
      ssl->out_msg[sVar6] = (uchar)(__n >> 0x10);
      ssl->out_msg[sVar6 + 1] = (uchar)(__n >> 8);
      ssl->out_msg[sVar6 + 2] = (uchar)__n;
      memcpy(ssl->out_msg + sVar6 + 3,(pmVar5->raw).p,__n);
      sVar6 = __n + sVar6 + 3;
    }
    lVar1 = sVar6 - 7;
    ssl->out_msg[4] = (uchar)((ulong)lVar1 >> 0x10);
    ssl->out_msg[5] = (uchar)((ulong)lVar1 >> 8);
    ssl->out_msg[6] = (uchar)lVar1;
    ssl->out_msglen = sVar6;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\v';
    ssl->state = ssl->state + 1;
    ret = mbedtls_ssl_write_handshake_msg(ssl);
    if (ret == 0) {
      ret = 0;
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x1b4c,"<= write certificate");
    }
    else {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x1b48,"mbedtls_ssl_write_handshake_msg",ret);
    }
  }
  else {
    line = 0x1b06;
LAB_001cfab2:
    ret = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,line,"<= skip write certificate");
    ssl->state = ssl->state + 1;
  }
  return ret;
}

Assistant:

int mbedtls_ssl_write_certificate(mbedtls_ssl_context *ssl)
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    size_t i, n;
    const mbedtls_x509_crt *crt;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info =
        ssl->handshake->ciphersuite_info;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> write certificate"));

    if (!mbedtls_ssl_ciphersuite_uses_srv_cert(ciphersuite_info)) {
        MBEDTLS_SSL_DEBUG_MSG(2, ("<= skip write certificate"));
        ssl->state++;
        return 0;
    }

#if defined(MBEDTLS_SSL_CLI_C)
    if (ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT) {
        if (ssl->handshake->client_auth == 0) {
            MBEDTLS_SSL_DEBUG_MSG(2, ("<= skip write certificate"));
            ssl->state++;
            return 0;
        }
    }
#endif /* MBEDTLS_SSL_CLI_C */
#if defined(MBEDTLS_SSL_SRV_C)
    if (ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER) {
        if (mbedtls_ssl_own_cert(ssl) == NULL) {
            /* Should never happen because we shouldn't have picked the
             * ciphersuite if we don't have a certificate. */
            return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
        }
    }
#endif

    MBEDTLS_SSL_DEBUG_CRT(3, "own certificate", mbedtls_ssl_own_cert(ssl));

    /*
     *     0  .  0    handshake type
     *     1  .  3    handshake length
     *     4  .  6    length of all certs
     *     7  .  9    length of cert. 1
     *    10  . n-1   peer certificate
     *     n  . n+2   length of cert. 2
     *    n+3 . ...   upper level cert, etc.
     */
    i = 7;
    crt = mbedtls_ssl_own_cert(ssl);

    while (crt != NULL) {
        n = crt->raw.len;
        if (n > MBEDTLS_SSL_OUT_CONTENT_LEN - 3 - i) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("certificate too large, %" MBEDTLS_PRINTF_SIZET
                                      " > %" MBEDTLS_PRINTF_SIZET,
                                      i + 3 + n, (size_t) MBEDTLS_SSL_OUT_CONTENT_LEN));
            return MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL;
        }

        ssl->out_msg[i] = MBEDTLS_BYTE_2(n);
        ssl->out_msg[i + 1] = MBEDTLS_BYTE_1(n);
        ssl->out_msg[i + 2] = MBEDTLS_BYTE_0(n);

        i += 3; memcpy(ssl->out_msg + i, crt->raw.p, n);
        i += n; crt = crt->next;
    }

    ssl->out_msg[4]  = MBEDTLS_BYTE_2(i - 7);
    ssl->out_msg[5]  = MBEDTLS_BYTE_1(i - 7);
    ssl->out_msg[6]  = MBEDTLS_BYTE_0(i - 7);

    ssl->out_msglen  = i;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_CERTIFICATE;

    ssl->state++;

    if ((ret = mbedtls_ssl_write_handshake_msg(ssl)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_write_handshake_msg", ret);
        return ret;
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= write certificate"));

    return ret;
}